

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O1

Config * __thiscall QPDFJob::Config::splitPages(Config *this)

{
  int iVar1;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"");
  if (local_30 == 0) {
    iVar1 = 1;
  }
  else {
    iVar1 = QUtil::string_to_int((char *)local_38);
  }
  ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  split_pages = iVar1;
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::splitPages()
{
    return splitPages("");
}